

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O3

void nhr_response_add_body_data(nhr_response r,void *data,size_t data_size)

{
  ulong uVar1;
  void *mem;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  mem = r->body;
  sVar4 = r->body_len;
  uVar1 = sVar4 + data_size;
  if (r->body_size < uVar1) {
    mem = nhr_realloc(mem,uVar1);
    r->body = mem;
    r->body_size = uVar1;
    sVar4 = r->body_len;
  }
  memcpy((void *)(sVar4 + (long)mem),data,data_size);
  uVar3 = data_size + r->body_len;
  uVar1 = r->content_length;
  uVar2 = uVar1;
  if (uVar3 < uVar1) {
    uVar2 = uVar3;
  }
  if (uVar1 == 0) {
    uVar2 = uVar3;
  }
  r->body_len = uVar2;
  return;
}

Assistant:

void nhr_response_add_body_data(nhr_response r, void * data, const size_t data_size) {
	const size_t required = r->body_len + data_size;
	char * body = NULL;

	if (required > r->body_size) {
		r->body = nhr_realloc(r->body, required);
		r->body_size = required;
	}

	body = (char *)r->body;
	body += r->body_len;
	memcpy(body, data, data_size);
	r->body_len += data_size;
	nhr_response_fix_body_len(r);
}